

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<double>::Decompose_Cholesky
          (TPZSkylMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  undefined4 extraout_var;
  int64_t iVar4;
  double **ppdVar5;
  ostream *poVar6;
  void *this_00;
  list<long,_std::allocator<long>_> *this_01;
  long lVar7;
  TPZBaseMatrix *in_RDI;
  TPZBaseMatrix *this_02;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  uint l;
  uint tmp;
  uint max_l;
  double *end_i;
  double *elem_i;
  int64_t j;
  int64_t i;
  double *end_k;
  double *elem_k;
  double sum;
  int64_t k;
  int64_t dimension;
  type_conflict1 Tol;
  double pivot;
  char *in_stack_00000128;
  char *in_stack_00000130;
  list<long,_std::allocator<long>_> *in_stack_ffffffffffffff30;
  value_type_conflict5 *in_stack_ffffffffffffff38;
  TPZSkylMatrix<double> *in_stack_ffffffffffffff40;
  undefined8 local_90;
  long local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  double *local_70;
  double *local_68;
  long local_60;
  long local_58;
  double *local_50;
  double *local_48;
  double local_40;
  long local_38;
  long local_30;
  double local_28;
  double local_20;
  
  if (in_RDI->fDecomposed != '\x03') {
    if (in_RDI->fDecomposed != '\0') {
      TPZMatrix<double>::Error(in_stack_00000130,in_stack_00000128);
    }
    std::__cxx11::list<long,_std::allocator<long>_>::clear(in_stack_ffffffffffffff30);
    ZeroTolerance<double,_nullptr>((double *)0x1375c05);
    iVar3 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_30 = CONCAT44(extraout_var,iVar3);
    for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
      iVar4 = Size(in_stack_ffffffffffffff40,(int64_t)in_stack_ffffffffffffff38);
      if (iVar4 == 0) {
        return 0;
      }
      local_40 = 0.0;
      ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_38);
      local_48 = *ppdVar5 + 1;
      ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_38);
      pdVar1 = *ppdVar5;
      iVar4 = Size(in_stack_ffffffffffffff40,(int64_t)in_stack_ffffffffffffff38);
      local_50 = pdVar1 + iVar4;
      for (; local_48 < local_50; local_48 = local_48 + 1) {
        local_40 = *local_48 * *local_48 + local_40;
      }
      this_02 = in_RDI + 1;
      ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)this_02,local_38);
      local_20 = **ppdVar5 - local_40;
      std::abs((int)this_02);
      if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < local_28) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  ((list<long,_std::allocator<long>_> *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38);
        poVar6 = std::operator<<((ostream *)&std::cout,"Decompose_Cholesky");
        poVar6 = std::operator<<(poVar6," Singular equation pivot ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_20);
        poVar6 = std::operator<<(poVar6," k ");
        this_00 = (void *)std::ostream::operator<<(poVar6,local_38);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        local_20 = 1.0;
      }
      dVar2 = sqrt(local_20);
      ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_38);
      **ppdVar5 = dVar2;
      local_60 = 2;
      local_20 = dVar2;
      local_58 = local_38;
      while (local_58 = local_58 + 1, local_58 < local_30) {
        iVar4 = Size(in_stack_ffffffffffffff40,(int64_t)in_stack_ffffffffffffff38);
        if (local_60 < iVar4) {
          local_40 = 0.0;
          ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_58);
          local_68 = *ppdVar5 + local_60;
          ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_58 + 1);
          local_70 = *ppdVar5;
          ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_38);
          local_74 = (uint)((long)local_70 - (long)local_68 >> 3);
          local_78 = (uint)((long)local_50 - (long)(*ppdVar5 + 1) >> 3);
          if (local_78 < local_74) {
            local_74 = local_78;
          }
          local_48 = *ppdVar5 + 1;
          for (local_7c = 0; local_7c < local_74; local_7c = local_7c + 1) {
            local_40 = *local_68 * *local_48 + local_40;
            local_68 = local_68 + 1;
            local_48 = local_48 + 1;
          }
          ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_58);
          dVar2 = ((*ppdVar5)[local_60 + -1] - local_40) / local_20;
          ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_58);
          (*ppdVar5)[local_60 + -1] = dVar2;
        }
        else {
          iVar4 = Size(in_stack_ffffffffffffff40,(int64_t)in_stack_ffffffffffffff38);
          dVar2 = local_20;
          if (iVar4 == local_60) {
            ppdVar5 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_58);
            (*ppdVar5)[local_60 + -1] = (*ppdVar5)[local_60 + -1] / dVar2;
          }
        }
        local_60 = local_60 + 1;
      }
    }
    iVar4 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar4 != 0) {
      iVar4 = TPZBaseMatrix::Rows(in_RDI);
      this_01 = (list<long,_std::allocator<long>_> *)(iVar4 + -1);
      iVar4 = TPZBaseMatrix::Rows(in_RDI);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,this_01,iVar4 + -1);
      if (ABS((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) < 1e-15) {
        iVar4 = TPZBaseMatrix::Rows(in_RDI);
        local_88 = iVar4 + -1;
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  (this_01,in_stack_ffffffffffffff38);
        iVar4 = TPZBaseMatrix::Rows(in_RDI);
        lVar7 = iVar4 + -1;
        iVar4 = TPZBaseMatrix::Rows(in_RDI);
        local_90 = 0x3ff0000000000000;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar7,iVar4 + -1,&local_90);
      }
    }
    in_RDI->fDecomposed = '\x03';
    in_RDI->fDefPositive = '\x01';
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular)
{
	if(this->fDecomposed == ECholesky) return 1;
	if (  this->fDecomposed )  TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
	dump_matrix(this, "TPZSkylMatrix::Decompose_Cholesky(singular)");
#endif
    
	singular.clear();
	TVar pivot;
	RTVar Tol;
	ZeroTolerance(Tol);
	int64_t dimension = this->Dim();
	/*  if(Dim() > 100) {
	 cout << "\nTPZSkylMatrix Cholesky decomposition Dim = " << Dim() << endl;
	 cout.flush();
	 }*/
	for ( int64_t k = 0; k < dimension; k++ )
	{
		/*    if(!(k%100) && Dim() > 100) {
		 cout <<  k << ' ';
		 cout.flush();
		 }
		 if(!(k%1000)) cout << endl;*/
		if ( Size(k) == 0 )	return( 0 );
		
		// Faz sum = SOMA( A(k,p) * A(k,p) ), p = 1, ..., k-1.
		//
		TVar sum = 0.0;
		TVar *elem_k = fElem[k]+1;
		TVar *end_k  = fElem[k]+Size(k);
        if constexpr (is_complex<TVar>::value){
            for ( ; elem_k < end_k; elem_k++ ) sum += std::conj(*elem_k) * (*elem_k);
        }else{
#pragma clang loop vectorize_width(2)
            for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
        }

		
		// Faz A(k,k) = sqrt( A(k,k) - sum ).
		//
		pivot = fElem[k][0] - sum;
        //		if ( pivot < ((TVar)1.e-9) ) {
		if(abs(pivot) < Tol) {
			singular.push_back(k);
            std::cout << __FUNCTION__ << " Singular equation pivot " << pivot << " k " << k << std::endl;
			pivot = 1.;
		}
		// A matriz nao e' definida positiva.
		
		pivot = fElem[k][0] = sqrt( pivot );
		
		// Loop para i = k+1 ... Dim().
		//
		int64_t i=k+1;
		for ( int64_t j = 2; i<dimension; j++,i++ ) {
			// Se tiverem elementos na linha 'i' cuja coluna e'
			//  menor do que 'K'...
			if ( Size(i) > j ) {
				// Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
				sum = 0.0;
				TVar *elem_i = &fElem[i][j];
				TVar *end_i  = fElem[i+1];
				elem_k = &(fElem[k][1]);
				// Vectorizable loop
				unsigned max_l = end_i - elem_i;
				unsigned tmp = end_k - elem_k;
				if (tmp < max_l) max_l = tmp;
                if constexpr (is_complex<TVar>::value){
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * std::conj(*elem_k++);
                }else{
#pragma clang loop vectorize_width(2)
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * (*elem_k++);
                }

				// Faz A(i,k) = (A(i,k) - sum) / A(k,k)
				fElem[i][j-1] = (fElem[i][j-1] -sum) / pivot;
			} else if ( Size(i) == j ) fElem[i][j-1] /= pivot;
			
			// Se nao tiverem estes elementos, sum = 0.0.
			
			// Se nao existir nem o elemento A(i,k), nao faz nada.
		}
	}
	
	if(this->Rows() && fabs(GetVal(this->Rows()-1,this->Rows()-1)) < fabs((TVar)1.e-15))
	{
		singular.push_back(this->Rows()-1);
		PutVal(this->Rows()-1,this->Rows()-1,1.);
	}
	this->fDecomposed  = ECholesky;
	this->fDefPositive = 1;
	return( 1 );
}